

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::prepare_bc1_single_color_table_half
               (bc1_match_entry *pTable,uint8_t *pExpand,int size,bc1_approx_mode mode)

{
  byte bVar1;
  uint v0;
  uint32_t uVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int e;
  int v;
  int hi_e;
  int hi;
  int lo_e;
  int lo;
  int lowest_e;
  int i;
  bc1_approx_mode in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 local_2c;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    local_20 = 0x100;
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      bVar1 = *(byte *)(in_RSI + local_24);
      for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
        v0 = (uint)*(byte *)(in_RSI + local_2c);
        if (in_EDX == 0x20) {
          in_stack_ffffffffffffffc4 =
               interp_half_5(v0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        }
        else {
          in_stack_ffffffffffffffc4 =
               interp_half_6(v0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        }
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffc4;
        in_stack_ffffffffffffffc8 = iabs(in_stack_ffffffffffffffc4 - local_1c);
        if ((in_ECX == 0) || (in_ECX == 3)) {
          uVar2 = iabs(v0 - bVar1);
          in_stack_ffffffffffffffc8 = (uVar2 * 3) / 100 + in_stack_ffffffffffffffc8;
        }
        if (((int)in_stack_ffffffffffffffc8 < (int)local_20) ||
           ((in_stack_ffffffffffffffc8 == local_20 && (local_24 == local_2c)))) {
          *(char *)(in_RDI + (long)local_1c * 3) = (char)local_2c;
          *(char *)(in_RDI + (long)local_1c * 3 + 1) = (char)local_24;
          *(char *)(in_RDI + (long)local_1c * 3 + 2) = (char)in_stack_ffffffffffffffc8;
          local_20 = in_stack_ffffffffffffffc8;
        }
      }
    }
  }
  return;
}

Assistant:

static void prepare_bc1_single_color_table_half(bc1_match_entry* pTable, const uint8_t* pExpand, int size, bc1_approx_mode mode)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size; lo++)
			{
				const int lo_e = pExpand[lo];

				for (int hi = 0; hi < size; hi++)
				{
					const int hi_e = pExpand[hi];
										
					const int v = (size == 32) ? interp_half_5(hi, lo, hi_e, lo_e, mode) : interp_half_6(hi, lo, hi_e, lo_e, mode);
											
					int e = iabs(v - i);

					// We only need to factor in 3% error in BC1 ideal mode.
					if ((mode == bc1_approx_mode::cBC1Ideal) || (mode == bc1_approx_mode::cBC1IdealRound4))
						e += (iabs(hi_e - lo_e) * 3) / 100;

					// Favor equal endpoints, for lower error on actual GPU's which approximate the interpolation.
					if ((e < lowest_e) || ((e == lowest_e) && (lo == hi)))
					{
						pTable[i].m_hi = static_cast<uint8_t>(hi);
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						
						assert(e <= UINT8_MAX);
						pTable[i].m_e = static_cast<uint8_t>(e);

						lowest_e = e;
					}

				} // hi
			} // lo
		}
	}